

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O2

string * __thiscall
puppup::movegen::toString_abi_cxx11_(string *__return_storage_ptr__,movegen *this,Gaddag *mov)

{
  long lVar1;
  pointer pvVar2;
  long *plVar3;
  ostream *poVar4;
  char *pcVar5;
  long *plVar6;
  long lVar7;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  makeMove((State *)&stack0x00000008,(Move *)this,mov);
  lVar1 = *(long *)(this + 8);
  pvVar2 = (mov->words_).
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = *(long *)(this + 0x10) -
          ((long)*(pointer *)
                  ((long)&pvVar2[lVar1].super__Vector_base<long,_std::allocator<long>_>._M_impl + 8)
           - *(long *)&pvVar2[lVar1].super__Vector_base<long,_std::allocator<long>_>._M_impl >> 3) *
          *(long *)(this + 0x18);
  if (*(long *)(this + 0x18) == 0x10) {
    poVar4 = std::ostream::_M_insert<long>((long)local_1a8);
    poVar4 = std::operator<<(poVar4,"ABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar7 / 0x10]);
  }
  else {
    poVar4 = std::operator<<(local_1a8,"ABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar7 / 0x10]);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  }
  std::operator<<(poVar4," ");
  plVar3 = *(pointer *)
            ((long)&pvVar2[lVar1].super__Vector_base<long,_std::allocator<long>_>._M_impl + 8);
  for (plVar6 = *(long **)&pvVar2[lVar1].super__Vector_base<long,_std::allocator<long>_>._M_impl;
      plVar6 != plVar3; plVar6 = plVar6 + 1) {
    pcVar5 = "EIAONTRSULDGYWVPMHFCBZXQKJ_    +";
    if (*(long *)(&stack0x00000810 + lVar7 * 8) != 0) {
      pcVar5 = "eiaontrsuldgywvpmhfcbzxqkj_    +";
    }
    std::operator<<(local_1a8,pcVar5[*plVar6]);
    lVar7 = lVar7 + *(long *)(this + 0x18);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const Move& mov, board::State state,
                            const trie::Gaddag& gaddag) {
    std::stringstream ss;
    makeMove(state, mov, gaddag);
    const auto& s = gaddag.getStringFromWord(mov.word);
    idx cursor = mov.cursor - s.size() * mov.step;
    idx x = cursor % 16 - board::board_min;
    idx y = cursor / 16 - board::board_min;
    if (mov.step == 16) {
        ss << x + 1 << ABC[y] << " ";
    } else {
        ss << ABC[y] << x + 1 << " ";
    }

    for (chr c : s) {
        if (state.letter_score[cursor] == 0) {
            ss << idxSTR[c];
        } else {
            ss << idxstr[c];
        }
        cursor += mov.step;
    }
    return ss.str();
}